

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
           *__return_storage_ptr__,FastGeneralizationsIterator *this)

{
  Renaming *this_00;
  TermList t;
  bool bVar1;
  int iVar2;
  Rhs *pRVar3;
  ResultSubstitution *pRVar4;
  RefCounter *pRVar5;
  undefined4 extraout_var;
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  pRVar3 = (Rhs *)CONCAT44(extraout_var,iVar2);
  if (this->_retrieveSubstitution == true) {
    this_00 = &this->_resultNormalizer;
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&this_00->_data);
    (this->_resultNormalizer)._nextVar = 0;
    (this->_resultNormalizer)._identity = true;
    t._content = (pRVar3->term)._sort._content;
    Kernel::Renaming::normalizeVariables(this_00,(TermList)(pRVar3->term).super_TermList._content);
    Kernel::Renaming::normalizeVariables(this_00,t);
    pRVar4 = (ResultSubstitution *)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    pRVar4->_vptr_ResultSubstitution = (_func_int **)&PTR__Substitution_00b2b3e8;
    pRVar4[1]._vptr_ResultSubstitution = (_func_int **)&this->_subst;
    pRVar4[2]._vptr_ResultSubstitution = (_func_int **)this_00;
    pRVar4[3]._vptr_ResultSubstitution = (_func_int **)0x0;
    pRVar5 = (RefCounter *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pRVar5->_val = 1;
  }
  else {
    pRVar4 = (ResultSubstitution *)0x0;
    pRVar5 = (RefCounter *)0x0;
  }
  (__return_storage_ptr__->unifier)._obj = pRVar4;
  (__return_storage_ptr__->unifier)._refCnt = pRVar5;
  __return_storage_ptr__->data = pRVar3;
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}